

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

int connection_get_properties(CONNECTION_HANDLE connection,fields *properties)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  int iVar3;
  
  if (connection == (CONNECTION_HANDLE)0x0 || properties == (fields *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x6a5;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_get_properties",0x6a4,1,
                "Bad arguments: connection = %p, properties = %p",connection,properties);
    }
  }
  else if (connection->properties == (AMQP_VALUE)0x0) {
    *properties = (fields)0x0;
    iVar3 = 0;
  }
  else {
    pAVar2 = amqpvalue_clone(connection->properties);
    *properties = pAVar2;
    iVar3 = 0;
    if (pAVar2 == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      iVar3 = 0x6ba;
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"connection_get_properties",0x6b9,1,"Cannot clone properties");
      }
    }
  }
  return iVar3;
}

Assistant:

int connection_get_properties(CONNECTION_HANDLE connection, fields* properties)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_269: [If connection or properties is NULL, connection_get_properties shall fail and return a non-zero value.] */
    if ((connection == NULL) ||
        (properties == NULL))
    {
        LogError("Bad arguments: connection = %p, properties = %p",
            connection, properties);
        result = MU_FAILURE;
    }
    else
    {
        if (connection->properties == NULL)
        {
            /* Codes_S_R_S_CONNECTION_01_270: [ If no properties have been set, `connection_get_properties` shall set `properties` to NULL. ]*/
            *properties = NULL;

            /* Codes_S_R_S_CONNECTION_01_271: [On success, connection_get_properties shall return 0.] */
            result = 0;
        }
        else
        {
            /* Codes_S_R_S_CONNECTION_01_272: [connection_get_properties shall return in the properties argument the current properties setting.] */
            /* Codes_S_R_S_CONNECTION_01_273: [ Cloning the properties shall be done by calling `fields_clone`. ]*/
            *properties = fields_clone(connection->properties);
            if (*properties == NULL)
            {
                /* Codes_S_R_S_CONNECTION_01_274: [ If `fields_clone` fails, `connection_get_properties` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone properties");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_S_R_S_CONNECTION_01_271: [On success, connection_get_properties shall return 0.] */
                result = 0;
            }
        }
    }

    return result;
}